

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ParserResult * __thiscall
Catch::clara::detail::
BoundLambda<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/titapo[P]ezy/build_O1/_deps/catch2-src/single_include/catch2/catch.hpp:9755:37)>
::setValue(ParserResult *__return_storage_ptr__,
          BoundLambda<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_titapo[P]ezy_build_O1__deps_catch2_src_single_include_catch2_catch_hpp:9755:37)>
          *this,string *arg)

{
  int iVar1;
  YesOrNo YVar2;
  long *plVar3;
  size_type *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> temp;
  string mode;
  string local_d8;
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined **local_58;
  undefined8 local_50;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38;
  undefined7 uStack_37;
  
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  ::std::__cxx11::string::_M_assign((string *)&local_d8);
  local_50 = 0;
  local_58 = &PTR__BasicResult_00241a88;
  local_40 = 0;
  local_38 = 0;
  local_48 = &local_38;
  toLower(&local_98,&local_d8);
  iVar1 = ::std::__cxx11::string::compare((char *)&local_98);
  if (iVar1 == 0) {
    YVar2 = Yes;
  }
  else {
    iVar1 = ::std::__cxx11::string::compare((char *)&local_98);
    if (iVar1 == 0) {
      YVar2 = No;
    }
    else {
      iVar1 = ::std::__cxx11::string::compare((char *)&local_98);
      if (iVar1 != 0) {
        ::std::operator+(&local_78,"colour mode must be one of: auto, yes or no. \'",&local_d8);
        plVar3 = (long *)::std::__cxx11::string::append((char *)&local_78);
        psVar4 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar4) {
          local_b8.field_2._M_allocated_capacity = *psVar4;
          local_b8.field_2._8_8_ = plVar3[3];
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        }
        else {
          local_b8.field_2._M_allocated_capacity = *psVar4;
          local_b8._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_b8._M_string_length = plVar3[1];
        *plVar3 = (long)psVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        BasicResult<Catch::clara::detail::ParseResultType>::BasicResult
                  (__return_storage_ptr__,RuntimeError,&local_b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
        goto LAB_0013e139;
      }
      YVar2 = Auto;
    }
  }
  ((this->m_lambda).config)->useColour = YVar2;
  *(undefined8 *)
   &(__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
    super_ResultBase.m_type = 0;
  (__return_storage_ptr__->super_ResultValueBase<Catch::clara::detail::ParseResultType>).
  super_ResultBase._vptr_ResultBase = (_func_int **)&PTR__BasicResult_00241a88;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
LAB_0013e139:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_58 = &PTR__BasicResult_00241a88;
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                             local_d8.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto setValue( std::string const &arg ) -> ParserResult override {
            return invokeLambda<typename UnaryLambdaTraits<L>::ArgType>( m_lambda, arg );
        }